

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

PyObject * PyInit_cmake_example(void)

{
  handle hVar1;
  handle hVar2;
  int iVar3;
  char *__s1;
  module_ m;
  cpp_function func;
  handle local_58;
  handle local_50;
  handle local_48;
  object local_40;
  accessor<pybind11::detail::accessor_policies::str_attr> local_38;
  
  __s1 = (char *)Py_GetVersion();
  iVar3 = strncmp(__s1,"3.10",4);
  if ((iVar3 == 0) && (9 < (byte)(__s1[4] - 0x30U))) {
    pybind11::detail::get_internals();
    pybind11::module_::create_extension_module
              ((module_ *)&local_58,"cmake_example",(char *)0x0,&pybind11_module_def_cmake_example);
    local_38.obj.m_ptr = local_58.m_ptr;
    local_38.key = "__doc__";
    local_38.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
    pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=
              (&local_38,
               (char (*) [205])
               "\n        Pybind11 example plugin\n        -----------------------\n\n        .. currentmodule:: cmake_example\n\n        .. autosummary::\n           :toctree: _generate\n\n           add\n           subtract\n    "
              );
    pybind11::object::~object(&local_38.cache);
    local_38._0_8_ = add;
    pybind11::module_::def<int(*)(int,int),char[86]>
              ((module_ *)&local_58,"add",(type **)&local_38,
               (char (*) [86])
               "\n        Add two numbers\n\n        Some other explanation about the add function.\n    "
              );
    hVar1.m_ptr = local_58.m_ptr;
    local_40.super_handle.m_ptr = (handle)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    local_48.m_ptr = (PyObject *)PyObject_GetAttrString(local_58.m_ptr,"subtract");
    if (local_48.m_ptr == (PyObject *)0x0) {
      PyErr_Clear();
      local_48.m_ptr = (PyObject *)&_Py_NoneStruct;
      __Py_NoneStruct = __Py_NoneStruct + 1;
    }
    hVar2.m_ptr = local_48.m_ptr;
    local_50.m_ptr = (PyObject *)0x0;
    pybind11::cpp_function::make_function_record((cpp_function *)&local_38);
    ((PyObject *)(local_38._0_8_ + 0x30))->ob_refcnt =
         (Py_ssize_t)
         pybind11::cpp_function::
         initialize<pybind11_init_cmake_example(pybind11::module_&)::$_0,int,int,int,pybind11::name,pybind11::scope,pybind11::sibling,char[96]>(pybind11_init_cmake_example(pybind11::module_&)::$_0&&,int(*)(int,int),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&,char_const(&)[96])
         ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
    *(undefined2 *)(local_38._0_8_ + 0x5c) = 2;
    *(code *)(local_38._0_8_ + 0x59) = (code)((byte)*(code *)(local_38._0_8_ + 0x59) & 0x9f);
    *(char **)local_38._0_8_ = "subtract";
    *(PyObject **)(local_38._0_8_ + 0x68) = hVar1.m_ptr;
    ((PyObject *)(local_38._0_8_ + 0x70))->ob_refcnt = (Py_ssize_t)hVar2.m_ptr;
    *(char **)(local_38._0_8_ + 8) =
         "\n        Subtract two numbers\n\n        Some other explanation about the subtract function.\n    "
    ;
    pybind11::cpp_function::initialize_generic
              ((cpp_function *)&local_50,(unique_function_record *)&local_38,"({int}, {int}) -> int"
               ,(type_info **)
                &pybind11::cpp_function::
                 initialize<pybind11_init_cmake_example(pybind11::module_&)::$_0,int,int,int,pybind11::name,pybind11::scope,pybind11::sibling,char[96]>(pybind11_init_cmake_example(pybind11::module_&)::$_0&&,int(*)(int,int),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&,char_const&[])
                 ::types,2);
    std::
    unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
    ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                   *)&local_38);
    pybind11::object::~object((object *)&local_48);
    pybind11::object::~object(&local_40);
    pybind11::module_::add_object((module_ *)&local_58,"subtract",local_50,true);
    pybind11::object::~object((object *)&local_50);
    local_38.obj.m_ptr = local_58.m_ptr;
    local_38.key = "__version__";
    local_38.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
    pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=
              (&local_38,(char (*) [1])0x115e12);
    pybind11::object::~object(&local_38.cache);
    pybind11::object::~object((object *)&local_58);
  }
  else {
    PyErr_Format(_PyExc_ImportError,
                 "Python version mismatch: module was compiled for Python %s, but the interpreter version is incompatible: %s."
                 ,"3.10",__s1);
    local_58.m_ptr = (PyObject *)0x0;
  }
  return local_58.m_ptr;
}

Assistant:

PYBIND11_MODULE(cmake_example, m) {
    m.doc() = R"pbdoc(
        Pybind11 example plugin
        -----------------------

        .. currentmodule:: cmake_example

        .. autosummary::
           :toctree: _generate

           add
           subtract
    )pbdoc";

    m.def("add", &add, R"pbdoc(
        Add two numbers

        Some other explanation about the add function.
    )pbdoc");

    m.def("subtract", [](int i, int j) { return i - j; }, R"pbdoc(
        Subtract two numbers

        Some other explanation about the subtract function.
    )pbdoc");

#ifdef VERSION_INFO
    m.attr("__version__") = MACRO_STRINGIFY(VERSION_INFO);
#else
    m.attr("__version__") = "dev";
#endif
}